

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O3

void __thiscall fasttext::Vector::addVector(Vector *this,Vector *source,real s)

{
  pointer pfVar1;
  pointer pfVar2;
  undefined1 auVar3 [16];
  long lVar4;
  long lVar5;
  undefined1 in_register_00001204 [12];
  
  pfVar1 = (source->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar2 = (this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar4 = (long)(this->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2;
  if (lVar4 == (long)(source->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pfVar1) {
    lVar4 = lVar4 >> 2;
    if (0 < lVar4) {
      lVar5 = 0;
      do {
        auVar3._4_12_ = in_register_00001204;
        auVar3._0_4_ = s;
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)pfVar1[lVar5]),auVar3,ZEXT416((uint)pfVar2[lVar5]));
        pfVar2[lVar5] = auVar3._0_4_;
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    return;
  }
  __assert_fail("size() == source.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/tshev[P]faster-FastText/src/vector.cc"
                ,0x31,"void fasttext::Vector::addVector(const Vector &, real)");
}

Assistant:

void Vector::addVector(const Vector& source, real s) {
  assert(size() == source.size());
  for (int64_t i = 0; i < size(); i++) {
    data_[i] += s * source.data_[i];
  }
}